

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<unsigned_long,3ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<unsigned_long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,_3UL>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  allocator *paVar4;
  char *pcVar5;
  char c;
  array<unsigned_long,_3UL> value;
  bool local_50 [8];
  undefined1 local_48 [24];
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (!bVar2) {
    return false;
  }
  bVar2 = MaybeNone(this);
  if (bVar2) {
    local_50[0] = false;
    local_48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
  }
  else {
    bVar2 = ParseBasicTypeTuple<unsigned_long,3ul>(this,&value);
    if (!bVar2) {
      pcVar5 = "Not starting with the tuple value of requested type.\n";
      paVar4 = (allocator *)&c;
      goto LAB_002bde36;
    }
    local_50[0] = true;
    local_48._0_8_ = value._M_elems[0];
    local_48._8_8_ = value._M_elems[1];
    local_48._16_8_ = value._M_elems[2];
  }
  ::std::
  vector<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>>
  ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>
            ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>>
              *)result,(optional<std::array<unsigned_long,_3UL>_> *)local_50);
  while (bVar2 = Eof(this), !bVar2) {
    bVar2 = SkipWhitespaceAndNewline(this,true);
    if (!bVar2) {
      return false;
    }
    bVar2 = Char1(this,&c);
    if (!bVar2) {
      return false;
    }
    if (c != sep) {
      pSVar1 = this->_sr;
      if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
        pSVar1->idx_ = uVar3;
      }
      break;
    }
    bVar2 = SkipWhitespaceAndNewline(this,true);
    if (!bVar2) {
      return false;
    }
    bVar2 = MaybeNone(this);
    if (bVar2) {
      local_50[0] = false;
      local_48._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
    }
    else {
      bVar2 = ParseBasicTypeTuple<unsigned_long,3ul>(this,&value);
      if (!bVar2) break;
      local_50[0] = true;
      local_48._16_8_ = value._M_elems[2];
      local_48._0_8_ = value._M_elems[0];
      local_48._8_8_ = value._M_elems[1];
    }
    ::std::
    vector<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>>
    ::emplace_back<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>
              ((vector<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<unsigned_long,3ul>>>>
                *)result,(optional<std::array<unsigned_long,_3UL>_> *)local_50);
  }
  if (*(long *)result != *(long *)(result + 8)) {
    return true;
  }
  pcVar5 = "Empty array.\n";
  paVar4 = (allocator *)&value;
LAB_002bde36:
  ::std::__cxx11::string::string((string *)local_50,pcVar5,paVar4);
  PushError(this,(string *)local_50);
  ::std::__cxx11::string::_M_dispose();
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}